

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Aig_Man_t * Pdr_ManDupAigWithClauses(Aig_Man_t *p,Vec_Ptr_t *vCubes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  Aig_Obj_t *p1;
  int iVar10;
  Aig_Man_t *pAVar11;
  long lVar12;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar10 = 0; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,iVar10);
    pAVar6 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
  }
  iVar10 = 0;
  do {
    if (vCubes->nSize <= iVar10) {
      iVar10 = 0;
      do {
        if (p->vObjs->nSize <= iVar10) {
          for (iVar10 = 0; iVar10 < p->nRegs; iVar10 = iVar10 + 1) {
            pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar10);
            pAVar6 = Aig_ObjChild0Copy(pAVar6);
            Aig_ObjCreateCo(p_00,pAVar6);
          }
          Aig_ManCleanup(p_00);
          Aig_ManSetRegNum(p_00,p->nRegs);
          pAVar11 = p_00;
          iVar10 = Aig_ManCheck(p_00);
          if (iVar10 == 0) {
            Abc_Print((int)pAVar11,"Aig_ManDupSimple(): The check has failed.\n");
          }
          return p_00;
        }
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar10);
        if ((pAVar6 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7)) {
          pAVar8 = Aig_ObjChild0Copy(pAVar6);
          if (((ulong)pAVar6 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
          }
          uVar9 = (ulong)pAVar6->pFanin1 & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)((ulong)((uint)pAVar6->pFanin1 & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          pAVar8 = Aig_And(p_00,pAVar8,p1);
          (pAVar6->field_5).pData = pAVar8;
        }
        iVar10 = iVar10 + 1;
      } while( true );
    }
    pvVar5 = Vec_PtrEntry(vCubes,iVar10);
    pAVar6 = p_00->pConst1;
    for (lVar12 = 0; lVar12 < *(int *)((long)pvVar5 + 0x10); lVar12 = lVar12 + 1) {
      iVar1 = Abc_Lit2Var(*(int *)((long)pvVar5 + lVar12 * 4 + 0x14));
      if (p->nRegs <= iVar1) {
        __assert_fail("Abc_Lit2Var(pCube->Lits[n]) < Saig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x13a,"Aig_Man_t *Pdr_ManDupAigWithClauses(Aig_Man_t *, Vec_Ptr_t *)");
      }
      iVar1 = p->nTruePis;
      iVar2 = Abc_Lit2Var(*(int *)((long)pvVar5 + lVar12 * 4 + 0x14));
      pvVar7 = Vec_PtrEntry(p_00->vCis,iVar1 + iVar2);
      uVar3 = Abc_LitIsCompl(*(int *)((long)pvVar5 + lVar12 * 4 + 0x14));
      pAVar6 = Aig_And(p_00,pAVar6,(Aig_Obj_t *)((ulong)uVar3 ^ (ulong)pvVar7));
    }
    Aig_ObjCreateCo(p_00,pAVar6);
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Pdr_ManDupAigWithClauses( Aig_Man_t * p, Vec_Ptr_t * vCubes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew, * pLit;
    Pdr_Set_t * pCube;
    int i, n;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create outputs for each cube
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
//        Pdr_SetPrintOne( pCube );
        pObjNew = Aig_ManConst1(pNew);
        for ( n = 0; n < pCube->nLits; n++ )
        {
            assert( Abc_Lit2Var(pCube->Lits[n]) < Saig_ManRegNum(p) );
            pLit = Aig_NotCond( Aig_ManCi(pNew, Saig_ManPiNum(p) + Abc_Lit2Var(pCube->Lits[n])), Abc_LitIsCompl(pCube->Lits[n]) );
            pObjNew = Aig_And( pNew, pObjNew, pLit );
        }
        Aig_ObjCreateCo( pNew, pObjNew );
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the POs
    Saig_ManForEachLi( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        Abc_Print(1, "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}